

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_blocked_sse41_128_16
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  undefined4 *puVar1;
  __m128i *palVar2;
  int iVar3;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  parasail_result_t *ppVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  size_t size;
  long lVar11;
  ulong uVar12;
  long lVar13;
  __m128i *palVar14;
  long lVar15;
  undefined2 uVar16;
  __m128i extraout_XMM0;
  __m128i alVar17;
  undefined1 auVar18 [16];
  short sVar19;
  undefined1 in_XMM1 [16];
  undefined1 auVar20 [16];
  short sVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  __m128i_16_t h;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  undefined1 auVar35 [16];
  ushort uVar42;
  ushort uVar43;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar52;
  short sVar53;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar54 [16];
  short sVar62;
  undefined1 auVar55 [16];
  undefined1 auVar63 [16];
  short sVar64;
  __m128i_16_t t;
  __m128i local_48;
  
  uVar5 = s1Len + 0xe;
  if (-1 < (int)(s1Len + 7U)) {
    uVar5 = s1Len + 7U;
  }
  uVar9 = (int)uVar5 >> 3;
  ptr = parasail_memalign___m128i(0x10,(long)(int)((uVar5 & 0xfffffff8) * 3));
  size = (size_t)(int)uVar9;
  ptr_00 = parasail_memalign___m128i(0x10,size);
  ptr_01 = parasail_memalign___m128i(0x10,size);
  iVar10 = 0;
  ppVar4 = parasail_result_new();
  uVar5 = 1;
  if (1 < (int)uVar9) {
    uVar5 = uVar9;
  }
  lVar7 = 0;
  alVar17 = extraout_XMM0;
  do {
    iVar10 = iVar10 + 1;
    while (s1Len < 1) {
      iVar10 = iVar10 + 1;
      if (iVar10 == 0x19) {
        auVar18 = pshuflw((undefined1  [16])alVar17,ZEXT416((uint)open),0);
        auVar18._4_4_ = auVar18._0_4_;
        auVar18._8_4_ = auVar18._0_4_;
        auVar18._12_4_ = auVar18._0_4_;
        auVar20 = pshuflw(in_XMM1,ZEXT416((uint)gap),0);
        auVar20._4_4_ = auVar20._0_4_;
        auVar20._8_4_ = auVar20._0_4_;
        auVar20._12_4_ = auVar20._0_4_;
        goto LAB_0068a476;
      }
    }
    lVar7 = (long)(int)lVar7;
    lVar11 = 0;
    uVar9 = 0;
    do {
      lVar13 = 0;
      lVar15 = lVar11;
      do {
        if (lVar15 < s1Len) {
          uVar16 = (undefined2)
                   matrix->matrix[(long)matrix->mapper[(byte)s1[lVar15]] * (long)matrix->size];
        }
        else {
          uVar16 = 0;
        }
        *(undefined2 *)((long)local_48 + lVar13) = uVar16;
        lVar15 = lVar15 + 1;
        lVar13 = lVar13 + 2;
      } while (lVar13 != 0x10);
      ptr[lVar7] = local_48;
      lVar7 = lVar7 + 1;
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 8;
    } while (uVar9 != uVar5);
    alVar17 = local_48;
  } while (iVar10 != 0x18);
  auVar18 = pshuflw((undefined1  [16])local_48,ZEXT416((uint)open),0);
  auVar18._4_4_ = auVar18._0_4_;
  auVar18._8_4_ = auVar18._0_4_;
  auVar18._12_4_ = auVar18._0_4_;
  auVar20 = pshuflw(in_XMM1,ZEXT416((uint)gap),0);
  auVar20._4_4_ = auVar20._0_4_;
  auVar20._8_4_ = auVar20._0_4_;
  auVar20._12_4_ = auVar20._0_4_;
  if (0 < s1Len) {
    auVar23 = pshuflw(ZEXT416((uint)-open),ZEXT416((uint)-open),0);
    uVar22 = auVar23._0_4_;
    lVar7 = 0;
    do {
      *(undefined1 (*) [16])((long)*ptr_00 + lVar7) = (undefined1  [16])0x0;
      puVar1 = (undefined4 *)((long)*ptr_01 + lVar7);
      *puVar1 = uVar22;
      puVar1[1] = uVar22;
      puVar1[2] = uVar22;
      puVar1[3] = uVar22;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar7);
  }
LAB_0068a476:
  if (s2Len < 1) {
    auVar23 = (undefined1  [16])0x0;
  }
  else {
    sVar19 = auVar20._0_2_;
    sVar25 = auVar18._14_2_;
    sVar21 = auVar20._14_2_;
    uVar8 = 0;
    auVar23 = (undefined1  [16])0x0;
    do {
      if (0 < s1Len) {
        iVar10 = matrix->mapper[(byte)s2[uVar8]];
        auVar35 = (undefined1  [16])0x0;
        uVar12 = 0;
        auVar24 = auVar23;
        uVar43 = 0xc000;
        do {
          alVar17 = ptr_00[uVar12];
          palVar2 = ptr_01 + uVar12;
          sVar26 = (short)(*palVar2)[0];
          sVar27 = *(short *)((long)*palVar2 + 2);
          sVar28 = *(short *)((long)*palVar2 + 4);
          sVar29 = *(short *)((long)*palVar2 + 6);
          sVar30 = (short)(*palVar2)[1];
          sVar31 = *(short *)((long)*palVar2 + 10);
          sVar32 = *(short *)((long)*palVar2 + 0xc);
          sVar33 = *(short *)((long)*palVar2 + 0xe);
          auVar54._0_8_ = alVar17[0] << 0x10;
          auVar54._8_8_ = alVar17[1] << 0x10 | alVar17[0] >> 0x30;
          auVar54 = auVar54 | auVar35;
          palVar2 = ptr + (long)iVar10 * size + uVar12;
          sVar53 = auVar54._0_2_ + (short)(*palVar2)[0];
          sVar56 = auVar54._2_2_ + *(short *)((long)*palVar2 + 2);
          sVar57 = auVar54._4_2_ + *(short *)((long)*palVar2 + 4);
          sVar58 = auVar54._6_2_ + *(short *)((long)*palVar2 + 6);
          sVar59 = auVar54._8_2_ + (short)(*palVar2)[1];
          sVar60 = auVar54._10_2_ + *(short *)((long)*palVar2 + 10);
          sVar61 = auVar54._12_2_ + *(short *)((long)*palVar2 + 0xc);
          sVar62 = auVar54._14_2_ + *(short *)((long)*palVar2 + 0xe);
          sVar46 = (ushort)(-1 < sVar26) * sVar26;
          sVar64 = (ushort)(-1 < sVar27) * sVar27;
          sVar52 = (ushort)(-1 < sVar28) * sVar28;
          sVar51 = (ushort)(-1 < sVar29) * sVar29;
          sVar50 = (ushort)(-1 < sVar30) * sVar30;
          sVar48 = (ushort)(-1 < sVar31) * sVar31;
          sVar49 = (ushort)(-1 < sVar32) * sVar32;
          sVar47 = (ushort)(-1 < sVar33) * sVar33;
          uVar34 = (ushort)(sVar46 < sVar53) * sVar53 | (ushort)(sVar46 >= sVar53) * sVar46;
          uVar36 = (ushort)(sVar64 < sVar56) * sVar56 | (ushort)(sVar64 >= sVar56) * sVar64;
          uVar37 = (ushort)(sVar52 < sVar57) * sVar57 | (ushort)(sVar52 >= sVar57) * sVar52;
          uVar38 = (ushort)(sVar51 < sVar58) * sVar58 | (ushort)(sVar51 >= sVar58) * sVar51;
          uVar39 = (ushort)(sVar50 < sVar59) * sVar59 | (ushort)(sVar50 >= sVar59) * sVar50;
          uVar40 = (ushort)(sVar48 < sVar60) * sVar60 | (ushort)(sVar48 >= sVar60) * sVar48;
          uVar41 = (ushort)(sVar49 < sVar61) * sVar61 | (ushort)(sVar49 >= sVar61) * sVar49;
          uVar42 = (ushort)(sVar47 < sVar62) * sVar62 | (ushort)(sVar47 >= sVar62) * sVar47;
          auVar35._0_2_ = uVar43 - auVar18._0_2_;
          auVar35._2_2_ = uVar34 - auVar18._2_2_;
          auVar35._4_2_ = uVar36 - auVar18._4_2_;
          auVar35._6_2_ = uVar37 - auVar18._6_2_;
          auVar35._8_2_ = uVar38 - auVar18._8_2_;
          auVar35._10_2_ = uVar39 - auVar18._10_2_;
          auVar35._12_2_ = uVar40 - auVar18._12_2_;
          auVar35._14_2_ = uVar41 - sVar25;
          auVar44._0_2_ = -(ushort)(0 < auVar35._0_2_);
          auVar44._2_2_ = -(ushort)(0 < auVar35._2_2_);
          auVar44._4_2_ = -(ushort)(0 < auVar35._4_2_);
          auVar44._6_2_ = -(ushort)(0 < auVar35._6_2_);
          auVar44._8_2_ = -(ushort)(0 < auVar35._8_2_);
          auVar44._10_2_ = -(ushort)(0 < auVar35._10_2_);
          auVar44._12_2_ = -(ushort)(0 < auVar35._12_2_);
          auVar44._14_2_ = -(ushort)(0 < auVar35._14_2_);
          auVar23 = auVar35;
          uVar43 = uVar42;
          if ((((((((((((((((auVar44 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar44 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar44 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar44 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar44 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar44 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar44 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar44 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar44 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar44 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar44 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44._14_2_ >> 7 & 1) != 0) || (auVar44._14_2_ & 0x8000) != 0) {
            do {
              sVar64 = -sVar19;
              auVar55._2_2_ = auVar35._0_2_ - auVar20._2_2_;
              auVar55._0_2_ = sVar64;
              auVar55._4_2_ = auVar35._2_2_ - auVar20._4_2_;
              auVar55._6_2_ = auVar35._4_2_ - auVar20._6_2_;
              auVar55._8_2_ = auVar35._6_2_ - auVar20._8_2_;
              auVar55._10_2_ = auVar35._8_2_ - auVar20._10_2_;
              auVar55._12_2_ = auVar35._10_2_ - auVar20._12_2_;
              auVar55._14_2_ = auVar35._12_2_ - sVar21;
              sVar46 = auVar23._0_2_;
              auVar63._0_2_ =
                   (ushort)(sVar46 < sVar64) * sVar64 | (ushort)(sVar46 >= sVar64) * sVar46;
              sVar64 = auVar23._2_2_;
              auVar63._2_2_ =
                   (ushort)(sVar64 < auVar55._2_2_) * auVar55._2_2_ |
                   (ushort)(sVar64 >= auVar55._2_2_) * sVar64;
              sVar64 = auVar23._4_2_;
              auVar63._4_2_ =
                   (ushort)(sVar64 < auVar55._4_2_) * auVar55._4_2_ |
                   (ushort)(sVar64 >= auVar55._4_2_) * sVar64;
              sVar64 = auVar23._6_2_;
              auVar63._6_2_ =
                   (ushort)(sVar64 < auVar55._6_2_) * auVar55._6_2_ |
                   (ushort)(sVar64 >= auVar55._6_2_) * sVar64;
              sVar64 = auVar23._8_2_;
              auVar63._8_2_ =
                   (ushort)(sVar64 < auVar55._8_2_) * auVar55._8_2_ |
                   (ushort)(sVar64 >= auVar55._8_2_) * sVar64;
              sVar64 = auVar23._10_2_;
              auVar63._10_2_ =
                   (ushort)(sVar64 < auVar55._10_2_) * auVar55._10_2_ |
                   (ushort)(sVar64 >= auVar55._10_2_) * sVar64;
              sVar64 = auVar23._12_2_;
              sVar46 = auVar23._14_2_;
              auVar63._12_2_ =
                   (ushort)(sVar64 < auVar55._12_2_) * auVar55._12_2_ |
                   (ushort)(sVar64 >= auVar55._12_2_) * sVar64;
              auVar63._14_2_ =
                   (ushort)(sVar46 < auVar55._14_2_) * auVar55._14_2_ |
                   (ushort)(sVar46 >= auVar55._14_2_) * sVar46;
              auVar45._0_2_ = -(ushort)(sVar19 < 0);
              auVar45._2_2_ = -(ushort)(0 < auVar55._2_2_);
              auVar45._4_2_ = -(ushort)(0 < auVar55._4_2_);
              auVar45._6_2_ = -(ushort)(0 < auVar55._6_2_);
              auVar45._8_2_ = -(ushort)(0 < auVar55._8_2_);
              auVar45._10_2_ = -(ushort)(0 < auVar55._10_2_);
              auVar45._12_2_ = -(ushort)(0 < auVar55._12_2_);
              auVar45._14_2_ = -(ushort)(0 < auVar55._14_2_);
              auVar35 = auVar55;
              auVar23 = auVar63;
            } while ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  || (auVar45 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                 (auVar45 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar45 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar45 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar45 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar45 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar45 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar45 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar45 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar45 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar45._14_2_ >> 7 & 1) != 0) || (auVar45._14_2_ & 0x8000) != 0);
            uVar34 = ((short)uVar34 < (short)auVar63._0_2_) * auVar63._0_2_ |
                     ((short)uVar34 >= (short)auVar63._0_2_) * uVar34;
            uVar36 = ((short)uVar36 < (short)auVar63._2_2_) * auVar63._2_2_ |
                     ((short)uVar36 >= (short)auVar63._2_2_) * uVar36;
            uVar37 = ((short)uVar37 < (short)auVar63._4_2_) * auVar63._4_2_ |
                     ((short)uVar37 >= (short)auVar63._4_2_) * uVar37;
            uVar38 = ((short)uVar38 < (short)auVar63._6_2_) * auVar63._6_2_ |
                     ((short)uVar38 >= (short)auVar63._6_2_) * uVar38;
            uVar39 = ((short)uVar39 < (short)auVar63._8_2_) * auVar63._8_2_ |
                     ((short)uVar39 >= (short)auVar63._8_2_) * uVar39;
            uVar40 = ((short)uVar40 < (short)auVar63._10_2_) * auVar63._10_2_ |
                     ((short)uVar40 >= (short)auVar63._10_2_) * uVar40;
            uVar41 = ((short)uVar41 < (short)auVar63._12_2_) * auVar63._12_2_ |
                     ((short)uVar41 >= (short)auVar63._12_2_) * uVar41;
            uVar42 = ((short)uVar42 < (short)auVar63._14_2_) * auVar63._14_2_ |
                     ((short)uVar42 >= (short)auVar63._14_2_) * uVar42;
            sVar64 = auVar63._14_2_ + (sVar25 - sVar21);
            uVar43 = (sVar64 < (short)uVar42) * uVar42 | (ushort)(sVar64 >= (short)uVar42) * sVar64;
          }
          palVar2 = ptr_00 + uVar12;
          palVar14 = ptr_01 + uVar12;
          auVar35 = (undefined1  [16])alVar17 >> 0x70;
          *(ushort *)*palVar2 = uVar34;
          *(ushort *)((long)*palVar2 + 2) = uVar36;
          *(ushort *)((long)*palVar2 + 4) = uVar37;
          *(ushort *)((long)*palVar2 + 6) = uVar38;
          *(ushort *)(*palVar2 + 1) = uVar39;
          *(ushort *)((long)*palVar2 + 10) = uVar40;
          *(ushort *)((long)*palVar2 + 0xc) = uVar41;
          *(ushort *)((long)*palVar2 + 0xe) = uVar42;
          sVar64 = auVar24._0_2_;
          auVar23._0_2_ =
               (sVar64 < (short)uVar34) * uVar34 | (ushort)(sVar64 >= (short)uVar34) * sVar64;
          sVar64 = auVar24._2_2_;
          auVar23._2_2_ =
               (sVar64 < (short)uVar36) * uVar36 | (ushort)(sVar64 >= (short)uVar36) * sVar64;
          sVar64 = auVar24._4_2_;
          auVar23._4_2_ =
               (sVar64 < (short)uVar37) * uVar37 | (ushort)(sVar64 >= (short)uVar37) * sVar64;
          sVar64 = auVar24._6_2_;
          auVar23._6_2_ =
               (sVar64 < (short)uVar38) * uVar38 | (ushort)(sVar64 >= (short)uVar38) * sVar64;
          sVar64 = auVar24._8_2_;
          auVar23._8_2_ =
               (sVar64 < (short)uVar39) * uVar39 | (ushort)(sVar64 >= (short)uVar39) * sVar64;
          sVar64 = auVar24._10_2_;
          auVar23._10_2_ =
               (sVar64 < (short)uVar40) * uVar40 | (ushort)(sVar64 >= (short)uVar40) * sVar64;
          sVar64 = auVar24._12_2_;
          sVar46 = auVar24._14_2_;
          auVar23._12_2_ =
               (sVar64 < (short)uVar41) * uVar41 | (ushort)(sVar64 >= (short)uVar41) * sVar64;
          auVar23._14_2_ =
               (sVar46 < (short)uVar42) * uVar42 | (ushort)(sVar46 >= (short)uVar42) * sVar46;
          sVar64 = uVar34 - auVar18._0_2_;
          sVar46 = uVar36 - auVar18._2_2_;
          sVar47 = uVar37 - auVar18._4_2_;
          sVar48 = uVar38 - auVar18._6_2_;
          sVar49 = uVar39 - auVar18._8_2_;
          sVar50 = uVar40 - auVar18._10_2_;
          sVar51 = uVar41 - auVar18._12_2_;
          sVar52 = uVar42 - sVar25;
          sVar26 = sVar26 - sVar19;
          sVar27 = sVar27 - auVar20._2_2_;
          sVar28 = sVar28 - auVar20._4_2_;
          sVar29 = sVar29 - auVar20._6_2_;
          sVar30 = sVar30 - auVar20._8_2_;
          sVar31 = sVar31 - auVar20._10_2_;
          sVar32 = sVar32 - auVar20._12_2_;
          sVar33 = sVar33 - sVar21;
          *(ushort *)*palVar14 =
               (ushort)(sVar26 < sVar64) * sVar64 | (ushort)(sVar26 >= sVar64) * sVar26;
          *(ushort *)((long)*palVar14 + 2) =
               (ushort)(sVar27 < sVar46) * sVar46 | (ushort)(sVar27 >= sVar46) * sVar27;
          *(ushort *)((long)*palVar14 + 4) =
               (ushort)(sVar28 < sVar47) * sVar47 | (ushort)(sVar28 >= sVar47) * sVar28;
          *(ushort *)((long)*palVar14 + 6) =
               (ushort)(sVar29 < sVar48) * sVar48 | (ushort)(sVar29 >= sVar48) * sVar29;
          *(ushort *)(*palVar14 + 1) =
               (ushort)(sVar30 < sVar49) * sVar49 | (ushort)(sVar30 >= sVar49) * sVar30;
          *(ushort *)((long)*palVar14 + 10) =
               (ushort)(sVar31 < sVar50) * sVar50 | (ushort)(sVar31 >= sVar50) * sVar31;
          *(ushort *)((long)*palVar14 + 0xc) =
               (ushort)(sVar32 < sVar51) * sVar51 | (ushort)(sVar32 >= sVar51) * sVar32;
          *(ushort *)((long)*palVar14 + 0xe) =
               (ushort)(sVar33 < sVar52) * sVar52 | (ushort)(sVar33 >= sVar52) * sVar33;
          uVar12 = uVar12 + 1;
          auVar24 = auVar23;
        } while (uVar12 != uVar5);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)s2Len);
  }
  iVar6 = -0x4000;
  iVar10 = 8;
  do {
    uVar8 = auVar23._0_8_;
    lVar7 = auVar23._8_8_;
    iVar3 = (int)auVar23._14_2_;
    if (auVar23._14_2_ < iVar6) {
      iVar3 = iVar6;
    }
    iVar6 = iVar3;
    auVar23._0_8_ = uVar8 << 0x10;
    auVar23._8_8_ = lVar7 << 0x10 | uVar8 >> 0x30;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  ppVar4->score = iVar6;
  ppVar4->flag = ppVar4->flag | 0x8202004;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppVar4;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 8; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_16;
    __m128i vGapO = _mm_set1_epi16(open);
    __m128i vGapE = _mm_set1_epi16(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi16(NEG_INF_16);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_16_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 14); /* rshift 3 */
            vH = _mm_slli_si128(vH, 2); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi16(vH, vP);
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vZero);

            vF = _mm_srli_si128(vF, 14);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 2));
            vF = _mm_sub_epi16(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi16(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi16(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 2);
                    vT2 = _mm_sub_epi16(vT2, vGapE);
                    vF = _mm_max_epi16(vF, vT2);
                }
                vH = _mm_max_epi16(vH, vF);
                vF = _mm_add_epi16(vF, vGapO);
                vF = _mm_sub_epi16(vF, vGapE);
                vF = _mm_max_epi16(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vMaxH, vH);

            vH = _mm_sub_epi16(vH, vGapO);
            vE = _mm_sub_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int16_t value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}